

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O0

RGB __thiscall pbrt::MIPMap::Lookup<pbrt::RGB>(MIPMap *this,Point2f *st,Vector2f dst0,Vector2f dst1)

{
  initializer_list<float> __l;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Point2f st_00;
  Vector2f dst1_00;
  Vector2f dst1_01;
  Vector2f dst0_00;
  Vector2f dst0_01;
  Point2f st_01;
  Point2f st_02;
  int iVar3;
  float *pfVar4;
  long in_RDI;
  Tuple2<pbrt::Vector2,_float> *pTVar5;
  Tuple2<pbrt::Vector2,_float> *pTVar6;
  type tVar7;
  type tVar8;
  type tVar9;
  float fVar10;
  Float FVar11;
  double dVar12;
  undefined8 uVar18;
  undefined1 in_ZMM0 [64];
  undefined1 auVar19 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 in_ZMM1 [64];
  RGB RVar20;
  int ilod;
  Float lod;
  Float scale;
  Float minorLength;
  Float majorLength;
  Float width;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  RGB *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  Float in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe9c;
  MIPMap *in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffeac;
  float in_stack_fffffffffffffeb0;
  float local_9c;
  float local_98;
  float local_94;
  undefined8 in_stack_ffffffffffffff80;
  int level;
  undefined4 in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  float in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  float in_stack_ffffffffffffffa8;
  Tuple2<pbrt::Vector2,_float> local_1c;
  Tuple2<pbrt::Vector2,_float> local_14;
  undefined8 local_c;
  Float local_4;
  undefined1 auVar13 [64];
  
  level = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_14 = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  local_1c = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(in_ZMM1._0_16_);
  if (*(int *)(in_RDI + 0x2c) == 3) {
    tVar7 = LengthSquared<float>
                      ((Vector2<float> *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    tVar8 = LengthSquared<float>
                      ((Vector2<float> *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    if (tVar7 < tVar8) {
      pstd::swap<pbrt::Vector2<float>>((Vector2<float> *)&local_14,(Vector2<float> *)&local_1c);
    }
    tVar9 = Length<float>((Vector2<float> *)0x703273);
    fVar10 = Length<float>((Vector2<float> *)0x703289);
    if ((fVar10 * *(float *)(in_RDI + 0x30) < tVar9) && (0.0 < fVar10)) {
      in_stack_ffffffffffffff8c = tVar9 / (fVar10 * *(float *)(in_RDI + 0x30));
      Tuple2<pbrt::Vector2,float>::operator*=
                ((Tuple2<pbrt::Vector2,float> *)&local_1c,in_stack_ffffffffffffff8c);
      fVar10 = in_stack_ffffffffffffff8c * fVar10;
    }
    if ((fVar10 != 0.0) || (NAN(fVar10))) {
      local_98 = 0.0;
      iVar3 = Levels((MIPMap *)0x7033a8);
      fVar10 = (float)(iVar3 + -1);
      FVar11 = Log2(0.0);
      local_9c = fVar10 + FVar11;
      pfVar4 = std::max<float>(&local_98,&local_9c);
      local_94 = *pfVar4;
      dVar12 = std::floor((double)(ulong)(uint)local_94);
      uVar18 = 0;
      st_01.super_Tuple2<pbrt::Point2,_float>.y = in_stack_ffffffffffffffa8;
      st_01.super_Tuple2<pbrt::Point2,_float>.x = in_stack_ffffffffffffffa4;
      dst0_00.super_Tuple2<pbrt::Vector2,_float>.y = in_stack_ffffffffffffffa0;
      dst0_00.super_Tuple2<pbrt::Vector2,_float>.x = in_stack_ffffffffffffff9c;
      dst1_00.super_Tuple2<pbrt::Vector2,_float>.y = in_stack_ffffffffffffff98;
      dst1_00.super_Tuple2<pbrt::Vector2,_float>.x = tVar9;
      RVar20 = EWA<pbrt::RGB>((MIPMap *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),level,
                              st_01,dst0_00,dst1_00);
      auVar19 = (undefined1  [56])0x0;
      auVar1._8_8_ = uVar18;
      auVar1._0_8_ = RVar20._0_8_;
      vmovlpd_avx(auVar1);
      RVar20 = pbrt::operator*(in_stack_fffffffffffffe44,in_stack_fffffffffffffe38);
      auVar15._0_8_ = RVar20._0_8_;
      auVar15._8_56_ = auVar19;
      vmovlpd_avx(auVar15._0_16_);
      fVar10 = local_94 - (float)(int)SUB84(dVar12,0);
      uVar18 = 0;
      st_02.super_Tuple2<pbrt::Point2,_float>.y = in_stack_ffffffffffffffa8;
      st_02.super_Tuple2<pbrt::Point2,_float>.x = in_stack_ffffffffffffffa4;
      dst0_01.super_Tuple2<pbrt::Vector2,_float>.y = in_stack_ffffffffffffffa0;
      dst0_01.super_Tuple2<pbrt::Vector2,_float>.x = in_stack_ffffffffffffff9c;
      dst1_01.super_Tuple2<pbrt::Vector2,_float>.y = in_stack_ffffffffffffff98;
      dst1_01.super_Tuple2<pbrt::Vector2,_float>.x = tVar9;
      RVar20 = EWA<pbrt::RGB>((MIPMap *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),level,
                              st_02,dst0_01,dst1_01);
      auVar19 = (undefined1  [56])0x0;
      auVar2._8_8_ = uVar18;
      auVar2._0_8_ = RVar20._0_8_;
      vmovlpd_avx(auVar2);
      RVar20 = pbrt::operator*(fVar10,in_stack_fffffffffffffe38);
      auVar16._0_8_ = RVar20._0_8_;
      auVar16._8_56_ = auVar19;
      vmovlpd_avx(auVar16._0_16_);
      RVar20 = RGB::operator+((RGB *)CONCAT44(fVar10,in_stack_fffffffffffffe40),
                              in_stack_fffffffffffffe38);
      local_4 = RVar20.b;
      auVar17._0_8_ = RVar20._0_8_;
      auVar17._8_56_ = auVar19;
      local_c = vmovlpd_avx(auVar17._0_16_);
    }
    else {
      auVar19 = ZEXT856(0);
      st_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffeb0;
      st_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffeac;
      RVar20 = Bilerp<pbrt::RGB>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,st_00);
      local_4 = RVar20.b;
      auVar14._0_8_ = RVar20._0_8_;
      auVar14._8_56_ = auVar19;
      local_c = vmovlpd_avx(auVar14._0_16_);
    }
  }
  else {
    pTVar6 = &local_14;
    pTVar5 = pTVar6;
    Tuple2<pbrt::Vector2,_float>::operator[](pTVar6,0);
    std::abs((int)pTVar5);
    Tuple2<pbrt::Vector2,_float>::operator[](pTVar6,1);
    std::abs((int)pTVar6);
    pTVar6 = &local_1c;
    pTVar5 = pTVar6;
    Tuple2<pbrt::Vector2,_float>::operator[](pTVar6,0);
    std::abs((int)pTVar5);
    Tuple2<pbrt::Vector2,_float>::operator[](pTVar6,1);
    std::abs((int)pTVar6);
    __l._M_len._0_4_ = in_stack_fffffffffffffe20;
    __l._M_array = (iterator)in_stack_fffffffffffffe18;
    __l._M_len._4_4_ = in_stack_fffffffffffffe24;
    std::max<float>(__l);
    auVar19 = (undefined1  [56])0x0;
    RVar20 = Lookup<pbrt::RGB>((MIPMap *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                               (Point2f *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff8c);
    local_4 = RVar20.b;
    auVar13._0_8_ = RVar20._0_8_;
    auVar13._8_56_ = auVar19;
    local_c = vmovlpd_avx(auVar13._0_16_);
  }
  RVar20.b = local_4;
  RVar20.r = (Float)(undefined4)local_c;
  RVar20.g = (Float)local_c._4_4_;
  return RVar20;
}

Assistant:

T MIPMap::Lookup(const Point2f &st, Vector2f dst0, Vector2f dst1) const {
    if (options.filter != FilterFunction::EWA) {
        Float width = std::max(
            {std::abs(dst0[0]), std::abs(dst0[1]), std::abs(dst1[0]), std::abs(dst1[1])});
        return Lookup<T>(st, 2 * width);
    }
    // Compute ellipse minor and major axes
    if (LengthSquared(dst0) < LengthSquared(dst1))
        pstd::swap(dst0, dst1);
    Float majorLength = Length(dst0);
    Float minorLength = Length(dst1);

    // Clamp ellipse eccentricity if too large
    if (minorLength * options.maxAnisotropy < majorLength && minorLength > 0) {
        Float scale = majorLength / (minorLength * options.maxAnisotropy);
        dst1 *= scale;
        minorLength *= scale;
    }
    if (minorLength == 0)
        return Bilerp<T>(0, st);

    // Choose level of detail for EWA lookup and perform EWA filtering
    Float lod = std::max<Float>(0, Levels() - 1 + Log2(minorLength));
    int ilod = std::floor(lod);
    // TODO: just do return EWA<T>(ilog, st, dst0, dst1);
    // TODO: also, when scaling camera ray differentials, just do e.g.
    // 1 / std::min(sqrtSamplesPerPixel, 8);
    return ((1 - (lod - ilod)) * EWA<T>(ilod, st, dst0, dst1) +
            (lod - ilod) * EWA<T>(ilod + 1, st, dst0, dst1));
}